

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseSelect(TidyDocImpl *doc,Node *field,GetTokenMode mode)

{
  int iVar1;
  Lexer *pLVar2;
  Node *pNVar3;
  Bool BVar4;
  uint uVar5;
  Node *node;
  Node **ppNVar6;
  
  pLVar2 = doc->lexer;
  if (field == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    if ((long)iVar1 < 0) {
      field = (Node *)0x0;
    }
    else {
      field = (doc->stack).content[iVar1].original_node;
      (doc->stack).top = iVar1 + -1;
    }
  }
  pLVar2->insert = (IStack *)0x0;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  while( true ) {
    if (node == (Node *)0x0) {
      prvTidyReport(doc,field,(Node *)0x0,0x25a);
      return (Node *)0x0;
    }
    if ((node->tag == field->tag) && (node->type == EndTag)) break;
    BVar4 = InsertMisc(field,node);
    if (BVar4 == no) {
      if ((((node->type == StartTag) && (node->tag != (Dict *)0x0)) &&
          (uVar5 = node->tag->id - TidyTag_OPTGROUP, uVar5 < 0x35)) &&
         ((0x10000000010003U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
        node->parent = field;
        pNVar3 = field->last;
        node->prev = pNVar3;
        ppNVar6 = &pNVar3->next;
        if (pNVar3 == (Node *)0x0) {
          ppNVar6 = &field->content;
        }
        *ppNVar6 = node;
        field->last = node;
        prvTidypushMemory(doc,(TidyParserMemory)
                              ZEXT2448(CONCAT816(node,CONCAT88(field,prvTidyParseSelect))));
        return node;
      }
      prvTidyReport(doc,field,node,0x235);
      prvTidyFreeNode(doc,node);
    }
    node = prvTidyGetToken(doc,IgnoreWhitespace);
  }
  prvTidyFreeNode(doc,node);
  field->closed = yes;
  TrimSpaces(doc,field);
  return (Node *)0x0;
}

Assistant:

Node* TY_(ParseSelect)( TidyDocImpl* doc, Node *field, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    DEBUG_LOG_COUNTERS;

    if ( field == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        field = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(field);
    }
    
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == field->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            field->closed = yes;
            TrimSpaces(doc, field);

            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(field, node))
            continue;

        if ( node->type == StartTag &&
             ( nodeIsOPTION(node)   ||
               nodeIsOPTGROUP(node) ||
               nodeIsDATALIST(node) ||
               nodeIsSCRIPT(node))
           )
        {
            TidyParserMemory memory = {0};
            memory.identity = TY_(ParseSelect);
            memory.original_node = field;
            memory.reentry_node = node;

            TY_(InsertNodeAtEnd)(field, node);
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, field, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, field, node, MISSING_ENDTAG_FOR);

    DEBUG_LOG_EXIT;
    return NULL;
}